

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_utility.h
# Opt level: O2

uint32_t imageio::convertSINT(uint32_t rawBits,uint32_t sourceBits,uint32_t targetBits)

{
  byte bVar1;
  uint uVar2;
  
  if (0x1e < sourceBits - 2) {
    __assert_fail("sourceBits > 1 && sourceBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                  ,0x116,"uint32_t imageio::convertSINT(uint32_t, uint32_t, uint32_t)");
  }
  if (targetBits - 2 < 0x1f) {
    bVar1 = (char)targetBits - 1;
    uVar2 = 0x7fffffff;
    if (targetBits < sourceBits) {
      uVar2 = ~(-1 << (bVar1 & 0x1f));
    }
    return (uint)((rawBits >> (sourceBits - 1 & 0x1f) & 1) != 0) << (bVar1 & 0x1f) |
           ~(-1 << ((byte)(sourceBits - 1) & 0x1f)) & rawBits & uVar2;
  }
  __assert_fail("targetBits > 1 && targetBits <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                ,0x117,"uint32_t imageio::convertSINT(uint32_t, uint32_t, uint32_t)");
}

Assistant:

[[nodiscard]] constexpr inline uint32_t convertSINT(uint32_t rawBits, uint32_t sourceBits, uint32_t targetBits) noexcept {
    assert(sourceBits > 1 && sourceBits <= 32);
    assert(targetBits > 1 && targetBits <= 32);

    const auto sourceSignBitIndex = sourceBits - 1u;
    const auto sourceSignMask = 1u << sourceSignBitIndex;
    const auto sign = (rawBits & sourceSignMask) != 0;
    const auto sourceValueBits = sourceBits - 1u;
    const auto sourceValueMask = (1u << sourceValueBits) - 1u;
    const auto sourceValue = rawBits & sourceValueMask;
    const auto targetSignBitIndex = targetBits - 1u;
    const auto targetValueBits = targetBits - 1u;
    const auto targetValueMask = (1u << targetValueBits) - 1u;

    uint32_t result = 0;
    result |= (sign ? 1u : 0u) << targetSignBitIndex;

    if (targetBits < sourceBits)
        result |= sourceValue & targetValueMask;
    else
        result |= sourceValue;

    return result;
}